

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O1

int trie_insert(trie t,vector keys,trie_value value)

{
  size_t sVar1;
  undefined8 *puVar2;
  set_value pvVar3;
  trie_node ptVar4;
  int iVar5;
  trie_value value_00;
  ulong uVar6;
  trie_node parent;
  bool bVar7;
  
  if (t == (trie)0x0) {
LAB_0010410b:
    iVar5 = 1;
  }
  else {
    sVar1 = vector_size(keys);
    iVar5 = 0;
    if (sVar1 != 0 && t->root != (trie_node)0x0) {
      uVar6 = 1;
      parent = t->root;
      do {
        puVar2 = (undefined8 *)vector_at(keys,uVar6 - 1);
        if ((parent->childs == (set)0x0) ||
           (pvVar3 = set_get(parent->childs,(set_key)*puVar2), pvVar3 == (set_value)0x0)) {
          ptVar4 = (trie_node)0x0;
        }
        else {
          ptVar4 = t->node_list + *(long *)((long)pvVar3 + 8);
        }
        bVar7 = true;
        if (ptVar4 == (trie_node)0x0) {
          value_00 = (trie_value)0x0;
          if (sVar1 == uVar6) {
            value_00 = value;
          }
          ptVar4 = trie_node_insert(t,parent,(trie_key)*puVar2,value_00);
          if (ptVar4 == (trie_node)0x0) {
            bVar7 = false;
            log_write_impl_va("metacall",0x17b,"trie_insert",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                              ,3,"Trie invalid node insertion");
            ptVar4 = parent;
          }
        }
        if (!bVar7) goto LAB_0010410b;
        iVar5 = 0;
      } while ((ptVar4 != (trie_node)0x0) &&
              (bVar7 = uVar6 < sVar1, uVar6 = uVar6 + 1, parent = ptVar4, bVar7));
    }
  }
  return iVar5;
}

Assistant:

int trie_insert(trie t, vector keys, trie_value value)
{
	if (t != NULL)
	{
		size_t iterator, size = vector_size(keys);

		trie_node current_node = t->root;

		for (iterator = 0; current_node != NULL && iterator < size; ++iterator)
		{
			trie_key *key_ptr = vector_at(keys, iterator);

			trie_node next_node = NULL;

			if (current_node->childs != NULL)
			{
				trie_node_ref node_ref = set_get(current_node->childs, *key_ptr);

				if (node_ref != NULL)
				{
					next_node = &t->node_list[node_ref->index];
				}
			}

			if (next_node == NULL)
			{
				if (iterator == (size - 1))
				{
					next_node = trie_node_insert(t, current_node, *key_ptr, value);
				}
				else
				{
					next_node = trie_node_insert(t, current_node, *key_ptr, NULL);
				}

				if (next_node == NULL)
				{
					log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid node insertion");

					return 1;
				}
			}

			current_node = next_node;
		}

		return 0;
	}

	return 1;
}